

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_0::RenderData::RenderData
          (RenderData *this,ObjectData *object,RenderContext *renderCtx,TestLog *log)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_type sVar5;
  long lVar6;
  const_reference pvVar7;
  Functions *gl;
  TestLog *log_local;
  RenderContext *renderCtx_local;
  ObjectData *object_local;
  RenderData *this_local;
  undefined4 extraout_var_01;
  
  glu::ShaderProgram::ShaderProgram(&this->m_program,renderCtx,&object->shader);
  iVar3 = (*renderCtx->_vptr_RenderContext[3])();
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&this->m_vao,(Functions *)CONCAT44(extraout_var,iVar3));
  iVar3 = (*renderCtx->_vptr_RenderContext[3])();
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&this->m_vbo,(Functions *)CONCAT44(extraout_var_00,iVar3));
  sVar5 = std::vector<float,_std::allocator<float>_>::size(&object->geometry);
  iVar3 = (int)sVar5;
  if (iVar3 < 0) {
    iVar3 = iVar3 + 3;
  }
  this->m_numVertices = iVar3 >> 2;
  iVar3 = (*renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var_01,iVar3);
  bVar2 = glu::ShaderProgram::isOk(&this->m_program);
  if (!bVar2) {
    glu::operator<<(log,&this->m_program);
  }
  pcVar1 = *(code **)(lVar6 + 0x40);
  dVar4 = glu::ObjectWrapper::operator*(&(this->m_vbo).super_ObjectWrapper);
  (*pcVar1)(0x8892,dVar4);
  pcVar1 = *(code **)(lVar6 + 0x150);
  sVar5 = std::vector<float,_std::allocator<float>_>::size(&object->geometry);
  pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](&object->geometry,0);
  (*pcVar1)(0x8892,sVar5 << 2,pvVar7,0x88e4);
  pcVar1 = *(code **)(lVar6 + 0x38);
  dVar4 = glu::ShaderProgram::getProgram(&this->m_program);
  (*pcVar1)(dVar4,0,"a_position");
  pcVar1 = *(code **)(lVar6 + 0xd8);
  dVar4 = glu::ObjectWrapper::operator*(&(this->m_vao).super_ObjectWrapper);
  (*pcVar1)(dVar4);
  (**(code **)(lVar6 + 0x19f0))(0,4,0x1406,0,0,0);
  (**(code **)(lVar6 + 0x610))(0);
  (**(code **)(lVar6 + 0xd8))(0);
  return;
}

Assistant:

RenderData::RenderData (const ObjectData& object, const  glu::RenderContext& renderCtx, TestLog& log)
	: m_program		(renderCtx, object.shader)
	, m_vao			(renderCtx.getFunctions())
	, m_vbo			(renderCtx.getFunctions())
	, m_numVertices	(int(object.geometry.size())/4)
{
	const glw::Functions& gl = renderCtx.getFunctions();

	if (!m_program.isOk())
		log << m_program;

	gl.bindBuffer(GL_ARRAY_BUFFER, *m_vbo);
	gl.bufferData(GL_ARRAY_BUFFER, object.geometry.size() * sizeof(float), &object.geometry[0], GL_STATIC_DRAW);
	gl.bindAttribLocation(m_program.getProgram(), 0, "a_position");

	gl.bindVertexArray(*m_vao);
	gl.vertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.enableVertexAttribArray(0);
	gl.bindVertexArray(0);
}